

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPdfEnginePrivate::AttachmentInfo>::moveAppend
          (QGenericArrayOps<QPdfEnginePrivate::AttachmentInfo> *this,AttachmentInfo *b,
          AttachmentInfo *e)

{
  qsizetype *pqVar1;
  AttachmentInfo *pAVar2;
  
  if (b != e) {
    pAVar2 = (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).ptr;
    for (; b < e; b = b + 1) {
      QPdfEnginePrivate::AttachmentInfo::AttachmentInfo
                (pAVar2 + (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).size,b)
      ;
      pqVar1 = &(this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }